

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VEnableLinearSumVectorArray_ManyVector(N_Vector v,int tf)

{
  code *pcVar1;
  
  pcVar1 = (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)
           0x0;
  if (tf != 0) {
    pcVar1 = N_VLinearSumVectorArray_ManyVector;
  }
  v->ops->nvlinearsumvectorarray = pcVar1;
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VEnableLinearSumVectorArray)(N_Vector v, sunbooleantype tf)
{
  /* enable/disable operation */
  if (tf)
  {
    v->ops->nvlinearsumvectorarray = MVAPPEND(N_VLinearSumVectorArray);
  }
  else { v->ops->nvlinearsumvectorarray = NULL; }

  /* return success */
  return SUN_SUCCESS;
}